

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::SequenceWithMatchExpr::fromSyntax
          (ParenthesizedSequenceExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  SequenceExprSyntax *pSVar2;
  undefined4 extraout_var;
  SequenceRepetition *pSVar3;
  SequenceWithMatchExpr *pSVar4;
  SyntaxNode *in_RSI;
  long in_RDI;
  SourceRange sourceRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> matchItems;
  optional<slang::ast::SequenceRepetition> repetition;
  AssertionExpr *expr;
  AssertionExpr *in_stack_00000260;
  ASTContext *in_stack_00000268;
  SequenceMatchListSyntax *in_stack_00000270;
  ASTContext *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0 [16];
  optional<slang::ast::SequenceRepetition> *in_stack_ffffffffffffffb0;
  ASTContext *in_stack_ffffffffffffffb8;
  DiagCode in_stack_ffffffffffffffd4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  optional<slang::ast::SequenceRepetition> *in_stack_ffffffffffffffe0;
  AssertionExpr *args;
  
  pSVar2 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x9b08ac);
  iVar1 = AssertionExpr::bind((int)pSVar2,(sockaddr *)in_RSI,0);
  args = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence(in_stack_ffffffffffffffa0._0_8_,in_stack_ffffffffffffff98);
  std::optional<slang::ast::SequenceRepetition>::optional
            ((optional<slang::ast::SequenceRepetition> *)0x9b08d9);
  if (*(long *)(in_RDI + 0x48) != 0) {
    std::optional<slang::ast::SequenceRepetition>::
    emplace<slang::syntax::SequenceRepetitionSyntax&,slang::ast::ASTContext_const&>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._8_8_,
               in_stack_ffffffffffffffa0._0_8_);
    pSVar3 = std::optional<slang::ast::SequenceRepetition>::operator->
                       ((optional<slang::ast::SequenceRepetition> *)0x9b0907);
    if (pSVar3->kind != Consecutive) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(in_RSI);
      ASTContext::addDiag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffd4,sourceRange);
    }
  }
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9b095a);
  if (*(long *)(in_RDI + 0x30) != 0) {
    bindMatchItems(in_stack_00000270,in_stack_00000268,in_stack_00000260);
  }
  ASTContext::getCompilation((ASTContext *)0x9b09a6);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SequenceWithMatchExpr,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRepetition>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                     ((BumpAllocator *)in_RSI,args,in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8);
  return &pSVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& SequenceWithMatchExpr::fromSyntax(const ParenthesizedSequenceExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& expr = bind(*syntax.expr, context);
    expr.requireSequence(context);

    std::optional<SequenceRepetition> repetition;
    if (syntax.repetition) {
        repetition.emplace(*syntax.repetition, context);
        if (repetition->kind != SequenceRepetition::Consecutive)
            context.addDiag(diag::SeqInstanceRepetition, syntax.repetition->sourceRange());
    }

    std::span<const Expression* const> matchItems;
    if (syntax.matchList)
        matchItems = bindMatchItems(*syntax.matchList, context, expr);

    return *context.getCompilation().emplace<SequenceWithMatchExpr>(expr, repetition, matchItems);
}